

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.h
# Opt level: O0

bool __thiscall Js::BufferReader::Read<Js::ThisInfo>(BufferReader *this,ThisInfo *data)

{
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ThisInfo *data_local;
  BufferReader *this_local;
  
  if (this->lengthLeft < 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileInfo.h"
                                ,0x3bc,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    this_local._7_1_ = false;
  }
  else {
    paVar1 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)this->current;
    (data->valueType).field_0 = *paVar1;
    data->thisType = *(Type *)(paVar1 + 1);
    this->current = this->current + 4;
    this->lengthLeft = this->lengthLeft - 4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Read(T * data)
        {
            if (lengthLeft < sizeof(T))
            {
                AssertOrFailFast(false);
                return false;
            }
            *data = *(T *)current;
            current += sizeof(T);
            lengthLeft -= sizeof(T);
            return true;
        }